

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_free(nk_context *ctx)

{
  nk_buffer *__s;
  undefined8 *puVar1;
  void *pvVar2;
  nk_plugin_free p_Var3;
  nk_page *pnVar4;
  nk_page *pnVar5;
  nk_context *__s_00;
  nk_style *__s_01;
  size_t sVar6;
  size_t sVar7;
  ulong __n;
  
  if (ctx != (nk_context *)0x0) {
    pvVar2 = (ctx->memory).memory.ptr;
    if (((pvVar2 != (void *)0x0) && ((ctx->memory).type != NK_BUFFER_FIXED)) &&
       (p_Var3 = (ctx->memory).pool.free, p_Var3 != (nk_plugin_free)0x0)) {
      (*p_Var3)((ctx->memory).pool.userdata,pvVar2);
    }
    if ((ctx->use_pool != 0) &&
       (pnVar5 = (ctx->pool).pages, pnVar5 != (nk_page *)0x0 && (ctx->pool).type != NK_BUFFER_FIXED)
       ) {
      do {
        pnVar4 = pnVar5->next;
        (*(ctx->pool).alloc.free)((ctx->pool).alloc.userdata,pnVar5);
        pnVar5 = pnVar4;
      } while (pnVar4 != (nk_page *)0x0);
    }
    sVar6 = (ulong)ctx & 3;
    if (sVar6 == 0) {
      sVar6 = 0x154;
      __s_00 = ctx;
    }
    else {
      sVar7 = -sVar6 + 4;
      memset(ctx,0,sVar7);
      memset((void *)((long)ctx + sVar7),0,0x150);
      __s_00 = (nk_context *)((long)ctx + -sVar6 + 0x154);
    }
    memset(__s_00,0,sVar6);
    __s = &ctx->memory;
    __s_01 = &ctx->style;
    sVar6 = (ulong)__s_01 & 3;
    if (sVar6 == 0) {
      sVar6 = 0x1d70;
    }
    else {
      sVar7 = -sVar6 + 4;
      memset(__s_01,0,sVar7);
      memset((void *)((long)__s_01 + sVar7),0,0x1d6c);
      __s_01 = (nk_style *)((long)__s_01 + -sVar6 + 0x1d70);
    }
    memset(__s_01,0,sVar6);
    __n = (ulong)__s & 3;
    if (__n == 0) {
      (ctx->memory).needed = 0;
      (ctx->memory).calls = 0;
      *(undefined8 *)&(ctx->memory).grow_factor = 0;
      (ctx->memory).allocated = 0;
      (ctx->memory).memory.ptr = (void *)0x0;
      (ctx->memory).memory.size = 0;
      (ctx->memory).pool.free = (nk_plugin_free)0x0;
      *(undefined8 *)&(ctx->memory).type = 0;
      (ctx->memory).pool.userdata.ptr = (void *)0x0;
      (ctx->memory).pool.alloc = (nk_plugin_alloc)0x0;
      *(undefined8 *)((ctx->memory).marker + 1) = 0;
      (ctx->memory).marker[1].offset = 0;
      *(undefined8 *)__s->marker = 0;
      (ctx->memory).marker[0].offset = 0;
      (ctx->memory).size = 0;
    }
    else {
      memset(__s,0,4 - __n);
      puVar1 = (undefined8 *)((long)__s + (4 - __n));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      *(undefined4 *)(puVar1 + 0xe) = 0;
      memset((void *)((long)puVar1 + 0x74),0,__n);
    }
    ctx->build = 0;
    ctx->begin = (nk_window *)0x0;
    ctx->end = (nk_window *)0x0;
    ctx->active = (nk_window *)0x0;
    ctx->current = (nk_window *)0x0;
    ctx->freelist = (nk_page_element *)0x0;
    ctx->count = 0;
    ctx->seq = 0;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x3e95,"void nk_free(struct nk_context *)");
}

Assistant:

NK_API void
nk_free(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_buffer_free(&ctx->memory);
    if (ctx->use_pool)
        nk_pool_free(&ctx->pool);

    nk_zero(&ctx->input, sizeof(ctx->input));
    nk_zero(&ctx->style, sizeof(ctx->style));
    nk_zero(&ctx->memory, sizeof(ctx->memory));

    ctx->seq = 0;
    ctx->build = 0;
    ctx->begin = 0;
    ctx->end = 0;
    ctx->active = 0;
    ctx->current = 0;
    ctx->freelist = 0;
    ctx->count = 0;
}